

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O0

void __thiscall QDBusPlatformMenu::syncMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  bool bVar1;
  QPlatformMenu *pQVar2;
  QDBusPlatformMenuItem *in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *item;
  QDBusPlatformMenuItem *in_stack_000000a8;
  QDBusMenuItemKeysList removed;
  QDBusMenuItemList updated;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff08;
  QList<QDBusMenuItemKeys> *_t1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff10;
  QDBusPlatformMenu *this_00;
  char *in_stack_ffffffffffffff18;
  QMessageLogger *in_stack_ffffffffffffff20;
  QDBusPlatformMenu *in_stack_ffffffffffffff58;
  QDBusPlatformMenu *in_stack_ffffffffffffff60;
  QDebug local_68;
  QDebug local_60 [3];
  undefined1 *local_48;
  QDBusPlatformMenuItem *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QDBusPlatformMenuItem::menu(in_RSI);
  if (pQVar2 != (QPlatformMenu *)0x0) {
    QDBusPlatformMenuItem::menu(in_RSI);
    syncSubMenu(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QDBusMenuItem>::QList((QList<QDBusMenuItem> *)0xb18e4b);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QDBusPlatformMenuItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QDBusMenuItemKeys>::QList((QList<QDBusMenuItemKeys> *)0xb18e85);
  QDBusMenuItem::QDBusMenuItem((QDBusMenuItem *)removed.d.d,in_stack_000000a8);
  QList<QDBusMenuItem>::operator<<
            ((QList<QDBusMenuItem> *)in_stack_ffffffffffffff10,(rvalue_ref)in_stack_ffffffffffffff08
            );
  QDBusMenuItem::~QDBusMenuItem((QDBusMenuItem *)0xb18eb9);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1f0b6c9::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1f0b6c9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb18f0c);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08,
               (char *)0xb18f22);
    QMessageLogger::debug();
    ::operator<<(in_RDI,(QList<QDBusMenuItem> *)in_stack_ffffffffffffff20);
    QDebug::~QDebug(local_60);
    QDebug::~QDebug(&local_68);
    local_10 = 0;
  }
  this_00 = (QDBusPlatformMenu *)&stack0xffffffffffffff60;
  QList<QDBusMenuItem>::QList
            ((QList<QDBusMenuItem> *)this_00,(QList<QDBusMenuItem> *)in_stack_ffffffffffffff08);
  _t1 = (QList<QDBusMenuItemKeys> *)&stack0xffffffffffffff48;
  QList<QDBusMenuItemKeys>::QList((QList<QDBusMenuItemKeys> *)this_00,_t1);
  propertiesUpdated(this_00,(QDBusMenuItemList *)_t1,(QDBusMenuItemKeysList *)0xb18fc2);
  QList<QDBusMenuItemKeys>::~QList((QList<QDBusMenuItemKeys> *)0xb18fcb);
  QList<QDBusMenuItem>::~QList((QList<QDBusMenuItem> *)0xb18fd5);
  QList<QDBusMenuItemKeys>::~QList((QList<QDBusMenuItemKeys> *)0xb18fdf);
  QList<QDBusMenuItem>::~QList((QList<QDBusMenuItem> *)0xb18fe9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    // if a submenu was added to this item, we need to connect to its signals
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    // TODO keep around copies of the QDBusMenuLayoutItems so they can be updated?
    // or eliminate them by putting dbus streaming operators in this class instead?
    // or somehow tell the dbusmenu client that something has changed, so it will ask for properties again
    QDBusMenuItemList updated;
    QDBusMenuItemKeysList removed;
    updated << QDBusMenuItem(item);
    qCDebug(qLcMenu) << updated;
    emit propertiesUpdated(updated, removed);
}